

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

Vector3f pbrt::SampleUniformHemisphere(Point2f *u)

{
  float fVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  Vector3f VVar6;
  
  fVar1 = (u->super_Tuple2<pbrt::Point2,_float>).x;
  auVar2 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar1),ZEXT416((uint)fVar1)
                           );
  auVar5._0_12_ = ZEXT812(0);
  auVar5._12_4_ = 0;
  auVar2 = vmaxss_avx(auVar2,auVar5);
  auVar2 = vsqrtss_avx(auVar2,auVar2);
  fVar4 = (u->super_Tuple2<pbrt::Point2,_float>).y * 6.2831855;
  fVar3 = cosf(fVar4);
  fVar4 = sinf(fVar4);
  auVar2 = vinsertps_avx(ZEXT416((uint)(fVar3 * auVar2._0_4_)),ZEXT416((uint)(fVar4 * auVar2._0_4_))
                         ,0x10);
  VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar2._0_8_;
  VVar6.super_Tuple3<pbrt::Vector3,_float>.z = fVar1;
  return (Vector3f)VVar6.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

PBRT_CPU_GPU
inline Vector3f SampleUniformHemisphere(const Point2f &u) {
    Float z = u[0];
    Float r = SafeSqrt(1 - z * z);
    Float phi = 2 * Pi * u[1];
    return {r * std::cos(phi), r * std::sin(phi), z};
}